

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonIntegrationPoints.h
# Opt level: O3

IntegrationPointList<2> *
anurbs::PolygonIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,Index degree,Polygon *polygon)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer ptVar5;
  tuple<double,_double,_double,_double> *norm_point;
  IntegrationPointList<3> *pIVar6;
  pointer ptVar7;
  _Head_base<1UL,_double,_false> *p_Var8;
  long lVar9;
  ulong index;
  IntegrationPointList<3> *__range3;
  PolygonTessellation tessellation;
  Vector2d vertex_c;
  Vector2d vertex_b;
  Vector2d vertex_a;
  PolygonTessellation local_a8;
  undefined1 local_78 [24];
  pointer pvStack_60;
  pointer local_58;
  pointer pvStack_50;
  TriangleIndices local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PolygonTessellation::compute(&local_a8,polygon);
  pIVar6 = IntegrationPoints::xiao_gimbutas(degree);
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  resize(__return_storage_ptr__,
         ((long)(pIVar6->
                super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar6->
                super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) *
         ((ulong)((long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl
                        .super__Vector_impl_data._M_start >> 3) / 3));
  if (0x10 < (ulong)((long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    lVar9 = 0;
    index = 0;
    do {
      PolygonTessellation::triangle(&local_48,&local_a8,index);
      Polygon::vertex((Polygon *)&local_58,(Index)polygon);
      Polygon::vertex((Polygon *)(local_78 + 0x10),(Index)polygon);
      Polygon::vertex((Polygon *)local_78,(Index)polygon);
      ptVar7 = (pIVar6->
               super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ptVar5 = (pIVar6->
               super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ptVar7 != ptVar5) {
        p_Var8 = &(__return_storage_ptr__->
                  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar9].
                  super__Tuple_impl<0UL,_double,_double,_double>.
                  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>;
        do {
          dVar1 = (ptVar7->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Tuple_impl<1UL,_double,_double,_double>.
                  super__Tuple_impl<2UL,_double,_double>.super__Tuple_impl<3UL,_double>.
                  super__Head_base<3UL,_double,_false>._M_head_impl;
          lVar9 = lVar9 + 1;
          dVar2 = (ptVar7->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Head_base<0UL,_double,_false>._M_head_impl;
          dVar3 = (ptVar7->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Tuple_impl<1UL,_double,_double,_double>.
                  super__Head_base<1UL,_double,_false>._M_head_impl;
          dVar4 = (ptVar7->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Tuple_impl<1UL,_double,_double,_double>.
                  super__Tuple_impl<2UL,_double,_double>.super__Head_base<2UL,_double,_false>.
                  _M_head_impl;
          p_Var8->_M_head_impl =
               dVar4 * (double)local_78._8_8_ +
               dVar3 * (double)pvStack_60 + dVar2 * (double)pvStack_50;
          p_Var8[1] = (_Head_base<1UL,_double,_false>)
                      (dVar4 * (double)local_78._0_8_ +
                      dVar3 * (double)local_78._16_8_ + dVar2 * (double)local_58);
          (((_Tuple_impl<1UL,_double,_double> *)(p_Var8 + -1))->super__Tuple_impl<2UL,_double>).
          super__Head_base<2UL,_double,_false>._M_head_impl =
               dVar1 * ABS(((double)pvStack_60 - (double)pvStack_50) *
                           ((double)local_78._0_8_ - (double)local_58) -
                           ((double)local_78._8_8_ - (double)pvStack_50) *
                           ((double)local_78._16_8_ - (double)local_58)) * 0.5;
          ptVar7 = ptVar7 + 1;
          p_Var8 = p_Var8 + 3;
        } while (ptVar7 != ptVar5);
      }
      index = index + 1;
    } while (index < (ulong)((long)local_a8.m_triangles.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_a8.m_triangles.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3) / 3);
  }
  if (local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const Index degree, const Polygon& polygon)
    {
        using Vector2d = Eigen::Matrix<double, 1, 2>;

        IntegrationPointList<2> integration_points;
        PolygonTessellation tessellation;

        tessellation.compute(polygon);

        const auto& xiao_gimbutas = IntegrationPoints::xiao_gimbutas(degree);

        const Index nb_integration_points = tessellation.nb_triangles() *
            static_cast<Index>(xiao_gimbutas.size());

        integration_points.resize(nb_integration_points);

        Index j = 0;

        for (Index i = 0; i < tessellation.nb_triangles(); i++) {
            const auto [a, b, c] = tessellation.triangle(i);

            const Vector2d vertex_a = polygon.vertex(a);
            const Vector2d vertex_b = polygon.vertex(b);
            const Vector2d vertex_c = polygon.vertex(c);

            const Vector2d ab = vertex_b - vertex_a;
            const Vector2d ac = vertex_c - vertex_a;

            const double area = 0.5 * norm(cross(ab, ac));

            for (const auto& norm_point : xiao_gimbutas) {
                const auto uv = vertex_a * std::get<0>(norm_point) +
                                vertex_b * std::get<1>(norm_point) +
                                vertex_c * std::get<2>(norm_point);

                integration_points[j++] = IntegrationPoint<2>(uv[0], uv[1],
                    area * std::get<3>(norm_point));
            }
        }

        return integration_points;
    }